

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

bool __thiscall
QHttpHeaders::replace(QHttpHeaders *this,qsizetype i,QAnyStringView name,QAnyStringView newValue)

{
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  Header local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValidHttpHeaderNameField(name);
  if (bVar2) {
    bVar2 = isValidHttpHeaderValueField(newValue);
    if (bVar2) {
      QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(&this->d);
      pQVar1 = (this->d).d.ptr;
      HeaderName::HeaderName(&local_70.name,name);
      normalizedValue(&local_70.value,newValue);
      QList<Header>::replace(&pQVar1->headers,i,&local_70);
      Header::~Header(&local_70);
      bVar2 = true;
      goto LAB_0018580f;
    }
  }
  bVar2 = false;
LAB_0018580f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::replace(qsizetype i, QAnyStringView name, QAnyStringView newValue)
{
    verify(i);
    if (!isValidHttpHeaderNameField(name) || !isValidHttpHeaderValueField(newValue))
        return false;

    d.detach();
    d->headers.replace(i, {HeaderName{name}, normalizedValue(newValue)});
    return true;
}